

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom.cpp
# Opt level: O0

Vector3d * ear::toCartesianVector3d(Vector3d *__return_storage_ptr__,PolarSpeakerPosition *position)

{
  PolarSpeakerPosition *position_local;
  
  cart(__return_storage_ptr__,position->azimuth,position->elevation,position->distance);
  return __return_storage_ptr__;
}

Assistant:

Eigen::Vector3d toCartesianVector3d(PolarSpeakerPosition position) {
    return cart(position.azimuth, position.elevation, position.distance);
  }